

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  char *__name;
  char *__service;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  stack_st_X509 *certs;
  X509 *pXVar6;
  EVP_PKEY *pkey;
  size_t sVar7;
  char *pcVar8;
  code *pcVar9;
  long lVar10;
  ptls_openssl_verify_certificate_t verify_certificate;
  ptls_context_t ctx;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t decrypt_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  sockaddr_storage sa;
  ptls_openssl_lookup_certificate_t lookup_certificate;
  addrinfo hints;
  ptls_openssl_verify_certificate_t local_1a8;
  addrinfo *local_190;
  uint8_t *local_188;
  size_t sStack_180;
  size_t *local_178;
  undefined8 uStack_170;
  code *local_168;
  ptls_key_exchange_algorithm_t **local_160;
  ptls_cipher_suite_t **local_158;
  ptls_openssl_lookup_certificate_t *local_150;
  ptls_openssl_verify_certificate_t *local_148;
  undefined8 local_140;
  undefined4 local_138;
  code **local_130;
  code **local_128;
  code **local_120;
  code *local_118;
  code *local_110;
  code *local_108;
  ptls_buffer_t local_100 [4];
  ptls_openssl_lookup_certificate_t local_80;
  addrinfo local_68;
  
  pkey = (EVP_PKEY *)0x0;
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  local_130 = &local_108;
  local_108 = encrypt_ticket_cb;
  local_128 = &local_110;
  local_110 = decrypt_ticket_cb;
  local_120 = &local_118;
  local_118 = save_ticket_cb;
  local_168 = ptls_openssl_random_bytes;
  local_160 = ptls_openssl_key_exchanges;
  local_158 = ptls_openssl_cipher_suites;
  local_150 = &local_80;
  local_148 = (ptls_openssl_verify_certificate_t *)0x0;
  local_140 = 0x200000015180;
  local_138 = 0;
  local_1a8.super.cb =
       (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
        *)0x0;
  local_1a8.cert_store = (X509_STORE *)0x0;
  local_178 = (size_t *)0x0;
  uStack_170 = 0;
  local_188 = (uint8_t *)0x0;
  sStack_180 = 0;
  ptls_openssl_init_lookup_certificate(local_150);
  bVar2 = true;
  certs = (stack_st_X509 *)0x0;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"c:k:es:vh");
      iVar4 = _optind;
      if (iVar3 < 0x6b) break;
      if (iVar3 == 0x73) {
        session_file = _optarg;
      }
      else if (iVar3 == 0x76) {
        ptls_openssl_init_verify_certificate(&local_1a8,(X509_STORE *)0x0);
      }
      else {
        if (iVar3 != 0x6b) goto LAB_00103e98;
        pFVar5 = fopen(_optarg,"rb");
        if (pFVar5 == (FILE *)0x0) {
          main_cold_2();
          return 1;
        }
        pkey = PEM_read_PrivateKey(pFVar5,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        fclose(pFVar5);
        if (pkey == (EVP_PKEY *)0x0) {
          main_cold_1();
          return 1;
        }
      }
    }
    if (iVar3 == -1) break;
    if (iVar3 == 99) {
      pFVar5 = fopen(_optarg,"rb");
      if (pFVar5 == (FILE *)0x0) {
        main_cold_4();
        return 1;
      }
      certs = (stack_st_X509 *)OPENSSL_sk_new(0);
      while (pXVar6 = PEM_read_X509(pFVar5,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0),
            pXVar6 != (X509 *)0x0) {
        OPENSSL_sk_push(certs);
      }
      fclose(pFVar5);
      iVar4 = OPENSSL_sk_num(certs);
      if (iVar4 == 0) {
        main_cold_3();
        return 1;
      }
    }
    else {
      if (iVar3 != 0x65) {
LAB_00103e98:
        usage(*argv);
        goto LAB_00103ea0;
      }
      bVar2 = false;
    }
  }
  lVar10 = (long)_optind;
  if (certs == (stack_st_X509 *)0x0 && pkey == (EVP_PKEY *)0x0) {
    if (session_file != (char *)0x0) {
      local_100[0].base = "";
      local_100[0].capacity = 0;
      local_100[0].off = 0;
      local_100[0].is_allocated = 0;
      pFVar5 = fopen(session_file,"rb");
      if ((pFVar5 != (FILE *)0x0) && (iVar3 = ptls_buffer_reserve(local_100,0x100), iVar3 == 0)) {
        do {
          sVar7 = fread(local_100[0].base + local_100[0].off,1,0x100,pFVar5);
          if (sVar7 == 0) {
            fclose(pFVar5);
            local_188 = local_100[0].base;
            sStack_180 = local_100[0].off;
            break;
          }
          local_100[0].off = local_100[0].off + sVar7;
          iVar3 = ptls_buffer_reserve(local_100,0x100);
        } while (iVar3 == 0);
      }
    }
    if (!bVar2) {
      local_178 = &main::max_early_data_size;
    }
  }
  else {
    if ((certs == (stack_st_X509 *)0x0) || (pkey == (EVP_PKEY *)0x0)) {
      main_cold_8();
      return 1;
    }
    if (session_file != (char *)0x0) {
      main_cold_5();
      return 1;
    }
    if (!bVar2) {
      main_cold_6();
      return 1;
    }
    ptls_openssl_lookup_certificate_add_identity(&local_80,"example.com",(EVP_PKEY *)pkey,certs);
    OPENSSL_sk_free(certs);
    EVP_PKEY_free(pkey);
  }
  if (local_1a8.super.cb ==
      (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
       *)0x0) {
    ptls_openssl_init_verify_certificate(&local_1a8,(X509_STORE *)0x0);
  }
  local_148 = &local_1a8;
  if (argc - iVar4 != 2) {
    main_cold_7();
    return 1;
  }
  __name = argv[lVar10];
  __service = argv[lVar10 + 1];
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 6;
  local_68.ai_flags = 0x421;
  local_68.ai_family = 0;
  iVar4 = getaddrinfo(__name,__service,&local_68,&local_190);
  pFVar5 = _stderr;
  if ((iVar4 == 0) && (local_190 != (addrinfo *)0x0)) {
    uVar1 = local_190->ai_addrlen;
    memcpy(local_100,local_190->ai_addr,(ulong)uVar1);
    freeaddrinfo(local_190);
    pcVar9 = run_client;
    if (certs != (stack_st_X509 *)0x0) {
      pcVar9 = run_server;
    }
    iVar4 = (*pcVar9)(local_100,uVar1,&local_168,&local_188);
    return iVar4;
  }
  if (iVar4 == 0) {
    pcVar8 = "getaddrinfo returned NULL";
  }
  else {
    pcVar8 = gai_strerror(iVar4);
  }
  fprintf(pFVar5,"failed to resolve address:%s:%s:%s\n",__name,__service,pcVar8);
LAB_00103ea0:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    ptls_openssl_lookup_certificate_t lookup_certificate;
    ptls_encrypt_ticket_t encrypt_ticket = {encrypt_ticket_cb}, decrypt_ticket = {decrypt_ticket_cb};
    ptls_save_ticket_t save_ticket = {save_ticket_cb};
    ptls_context_t ctx = {ptls_openssl_random_bytes,
                          ptls_openssl_key_exchanges,
                          ptls_openssl_cipher_suites,
                          &lookup_certificate.super,
                          NULL,
                          86400,
                          8192,
                          0,
                          &encrypt_ticket,
                          &decrypt_ticket,
                          &save_ticket};
    ptls_openssl_verify_certificate_t verify_certificate = {{NULL}};
    ptls_handshake_properties_t hsprop = {{{NULL}}};
    const char *host, *port;
    STACK_OF(X509) *certs = NULL;
    EVP_PKEY *pkey = NULL;
    int use_early_data = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;

    ptls_openssl_init_lookup_certificate(&lookup_certificate);

    while ((ch = getopt(argc, argv, "c:k:es:vh")) != -1) {
        switch (ch) {
        case 'c': {
            FILE *fp;
            X509 *cert;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            certs = sk_X509_new(NULL);
            while ((cert = PEM_read_X509(fp, NULL, NULL, NULL)) != NULL)
                sk_X509_push(certs, cert);
            fclose(fp);
            if (sk_X509_num(certs) == 0) {
                fprintf(stderr, "failed to load certificate chain from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'k': {
            FILE *fp;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            session_file = optarg;
            break;
        case 'v':
            ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
            break;
        default:
            usage(argv[0]);
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if (certs != NULL || pkey != NULL) {
        /* server */
        if (certs == NULL || pkey == NULL) {
            fprintf(stderr, "-c and -k options must be used together\n");
            return 1;
        }
        if (session_file != NULL) {
            fprintf(stderr, "-s option cannot be used for server\n");
            return 1;
        }
        if (use_early_data) {
            fprintf(stderr, "-e option cannot be used for server\n");
            return 1;
        }
        ptls_openssl_lookup_certificate_add_identity(&lookup_certificate, "example.com", pkey, certs);
        sk_X509_free(certs);
        EVP_PKEY_free(pkey);
    } else {
        /* client */
        if (session_file != NULL) {
            ptls_buffer_t sessdata;
            ptls_buffer_init(&sessdata, "", 0);
            if (load_ticket(&sessdata) == 0)
                hsprop.client.session_ticket = ptls_iovec_init(sessdata.base, sessdata.off);
        }
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (verify_certificate.super.cb == NULL)
        ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
    ctx.verify_certificate = &verify_certificate.super;
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port) != 0)
        exit(1);

    return (certs != NULL ? run_server : run_client)((struct sockaddr *)&sa, salen, &ctx, &hsprop);
}